

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

void sbox_s256_lowmc_full(mzd_local_t *in,word256 mask_a,word256 mask_b,word256 mask_c)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 (*in_RDI) [32];
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  undefined8 in_YMM1_H;
  undefined8 in_register_00001258;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  undefined8 in_YMM2_H;
  undefined8 in_register_00001298;
  word256 t2;
  word256 t1;
  word256 t0;
  word256 x2m;
  word256 x1m;
  word256 x0m;
  word256 min;
  ulong local_800;
  ulong uStack_7f8;
  ulong uStack_7f0;
  ulong uStack_7e8;
  undefined1 local_7e0 [16];
  ulong uStack_7d0;
  ulong uStack_7c8;
  undefined1 local_7c0 [16];
  ulong uStack_7b0;
  ulong uStack_7a8;
  ulong local_7a0;
  ulong uStack_798;
  ulong uStack_790;
  ulong uStack_788;
  ulong local_780;
  ulong uStack_778;
  ulong uStack_770;
  ulong uStack_768;
  ulong local_760;
  ulong uStack_758;
  ulong uStack_750;
  ulong uStack_748;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar1 = vpand_avx2(*in_RDI,auVar1);
  auVar2._8_8_ = in_XMM1_Qb;
  auVar2._0_8_ = in_XMM1_Qa;
  auVar2._16_8_ = in_YMM1_H;
  auVar2._24_8_ = in_register_00001258;
  auVar2 = vpand_avx2(*in_RDI,auVar2);
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = in_XMM2_Qa;
  auVar3._16_8_ = in_YMM2_H;
  auVar3._24_8_ = in_register_00001298;
  auVar3 = vpand_avx2(*in_RDI,auVar3);
  auVar5 = vpsllq_avx2(auVar1,ZEXT416(2));
  auVar1 = vpsrlq_avx2(auVar1,ZEXT416(0x3e));
  auVar1 = vpermq_avx2(auVar1,0x93);
  auVar5 = vpor_avx2(auVar5,auVar1);
  auVar1 = vpsllq_avx2(auVar2,ZEXT416(1));
  auVar2 = vpsrlq_avx2(auVar2,ZEXT416(0x3f));
  auVar2 = vpermq_avx2(auVar2,0x93);
  auVar4 = vpor_avx2(auVar1,auVar2);
  local_780 = auVar4._0_8_;
  uStack_778 = auVar4._8_8_;
  uStack_770 = auVar4._16_8_;
  uStack_768 = auVar4._24_8_;
  local_7a0 = auVar3._0_8_;
  uStack_798 = auVar3._8_8_;
  uStack_790 = auVar3._16_8_;
  uStack_788 = auVar3._24_8_;
  auVar1 = vpand_avx2(auVar4,auVar3);
  local_760 = auVar5._0_8_;
  uStack_758 = auVar5._8_8_;
  uStack_750 = auVar5._16_8_;
  uStack_748 = auVar5._24_8_;
  auVar2 = vpand_avx2(auVar5,auVar3);
  auVar3 = vpand_avx2(auVar5,auVar4);
  local_7c0._0_8_ = auVar1._0_8_;
  local_7c0._8_8_ = auVar1._8_8_;
  uStack_7b0 = auVar1._16_8_;
  uStack_7a8 = auVar1._24_8_;
  local_7c0._8_8_ = local_7c0._8_8_ ^ uStack_758;
  local_7c0._0_8_ = local_7c0._0_8_ ^ local_760;
  local_7e0._0_8_ = auVar2._0_8_;
  local_7e0._8_8_ = auVar2._8_8_;
  uStack_7d0 = auVar2._16_8_;
  uStack_7c8 = auVar2._24_8_;
  uStack_7d0 = uStack_7d0 ^ uStack_750 ^ uStack_770;
  uStack_7c8 = uStack_7c8 ^ uStack_748 ^ uStack_768;
  local_7e0._8_8_ = local_7e0._8_8_ ^ uStack_758 ^ uStack_778;
  local_7e0._0_8_ = local_7e0._0_8_ ^ local_760 ^ local_780;
  local_800 = auVar3._0_8_;
  uStack_7f8 = auVar3._8_8_;
  uStack_7f0 = auVar3._16_8_;
  uStack_7e8 = auVar3._24_8_;
  auVar7._16_8_ = uStack_7b0 ^ uStack_750;
  auVar7._0_16_ = local_7c0;
  auVar7._24_8_ = uStack_7a8 ^ uStack_748;
  auVar2 = vpsrlq_avx2(auVar7,ZEXT416(2));
  auVar4._16_8_ = uStack_7b0 ^ uStack_750;
  auVar4._0_16_ = local_7c0;
  auVar4._24_8_ = uStack_7a8 ^ uStack_748;
  auVar1 = vpsllq_avx2(auVar4,ZEXT416(0x3e));
  auVar1 = vpermq_avx2(auVar1,0x39);
  auVar1 = vpor_avx2(auVar2,auVar1);
  auVar6._16_8_ = uStack_7d0;
  auVar6._0_16_ = local_7e0;
  auVar6._24_8_ = uStack_7c8;
  auVar3 = vpsrlq_avx2(auVar6,ZEXT416(1));
  auVar5._16_8_ = uStack_7d0;
  auVar5._0_16_ = local_7e0;
  auVar5._24_8_ = uStack_7c8;
  auVar2 = vpsllq_avx2(auVar5,ZEXT416(0x3f));
  auVar2 = vpermq_avx2(auVar2,0x39);
  auVar2 = vpor_avx2(auVar3,auVar2);
  local_7c0._0_8_ = auVar1._0_8_;
  local_7c0._8_8_ = auVar1._8_8_;
  uStack_7b0 = auVar1._16_8_;
  uStack_7a8 = auVar1._24_8_;
  local_7e0._0_8_ = auVar2._0_8_;
  local_7e0._8_8_ = auVar2._8_8_;
  uStack_7d0 = auVar2._16_8_;
  uStack_7c8 = auVar2._24_8_;
  *(ulong *)*in_RDI =
       local_7c0._0_8_ ^ local_7e0._0_8_ ^ local_800 ^ local_760 ^ local_780 ^ local_7a0;
  *(ulong *)(*in_RDI + 8) =
       local_7c0._8_8_ ^ local_7e0._8_8_ ^ uStack_7f8 ^ uStack_758 ^ uStack_778 ^ uStack_798;
  *(ulong *)(*in_RDI + 0x10) =
       uStack_7b0 ^ uStack_7d0 ^ uStack_7f0 ^ uStack_750 ^ uStack_770 ^ uStack_790;
  *(ulong *)(*in_RDI + 0x18) =
       uStack_7a8 ^ uStack_7c8 ^ uStack_7e8 ^ uStack_748 ^ uStack_768 ^ uStack_788;
  return;
}

Assistant:

ATTR_TARGET_AVX2
static inline void sbox_s256_lowmc_full(mzd_local_t* in, const word256 mask_a, const word256 mask_b,
                                        const word256 mask_c) {
  const word256 min = mm256_load(in);
  // a
  word256 x0m = mm256_and(min, mask_a);
  // b
  word256 x1m = mm256_and(min, mask_b);
  // c
  word256 x2m = mm256_and(min, mask_c);

  x0m = mm256_rotate_left(x0m, 2);
  x1m = mm256_rotate_left(x1m, 1);

  // b & c
  word256 t0 = mm256_and(x1m, x2m);
  // a & c
  word256 t1 = mm256_and(x0m, x2m);
  // a & b
  word256 t2 = mm256_and(x0m, x1m);

  // (b & c) ^ a
  t0 = mm256_xor(t0, x0m);

  // a ^ b
  x0m = mm256_xor(x0m, x1m);
  // a ^ b ^ (a & c)
  t1 = mm256_xor(t1, x0m);
  // a ^ b ^ c ^ (a & b)
  t2 = mm256_xor(mm256_xor(t2, x0m), x2m);

  t0 = mm256_rotate_right(t0, 2);
  t1 = mm256_rotate_right(t1, 1);

  mm256_store(in, mm256_xor(mm256_xor(t0, t1), t2));
}